

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,char *s,format_specs *specs,locale_ref param_4)

{
  basic_appender<char> bVar1;
  char *pcVar2;
  basic_string_view<char> s_00;
  
  if ((*(uint *)s & 7) == 3) {
    bVar1 = write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                      ((basic_appender<char>)this,out.container,(format_specs *)s);
    return (basic_appender<char>)bVar1.container;
  }
  if (out.container != (buffer<char> *)0x0) {
    pcVar2 = (char *)strlen((char *)out.container);
    s_00.size_ = (size_t)s;
    s_00.data_ = pcVar2;
    bVar1 = write<char,fmt::v11::basic_appender<char>>
                      (this,out,s_00,(format_specs *)param_4.locale_);
    return (basic_appender<char>)bVar1.container;
  }
  report_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s, const format_specs& specs,
                         locale_ref) -> OutputIt {
  if (specs.type() == presentation_type::pointer)
    return write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
  if (!s) report_error("string pointer is null");
  return write<Char>(out, basic_string_view<Char>(s), specs, {});
}